

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O0

void __thiscall Sandbox::onFileChange(Sandbox *this,WatchFileList *_files,int index)

{
  bool bVar1;
  reference pvVar2;
  string local_130;
  string local_110;
  tuple<FileType&,std::__cxx11::string&> local_f0 [20];
  FileType local_dc;
  tuple<FileType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  tuple<FileType&,std::__cxx11::string&> local_b0 [20];
  FileType local_9c;
  tuple<FileType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  anon_class_8_1_bc207785 local_60;
  anon_class_8_1_bc207785 dependency_matches_filename;
  anon_class_24_3_63137608 reset_shaders;
  string filename;
  FileType type;
  int index_local;
  WatchFileList *_files_local;
  Sandbox *this_local;
  
  filename.field_2._12_4_ = index;
  pvVar2 = std::vector<WatchFile,_std::allocator<WatchFile>_>::operator[](_files,(long)index);
  filename.field_2._8_4_ = pvVar2->type;
  pvVar2 = std::vector<WatchFile,_std::allocator<WatchFile>_>::operator[]
                     (_files,(long)(int)filename.field_2._12_4_);
  std::__cxx11::string::string((string *)&reset_shaders._files,(string *)pvVar2);
  dependency_matches_filename.filename = (string *)&reset_shaders._files;
  local_60.filename = (string *)&reset_shaders._files;
  reset_shaders.filename = (string *)this;
  reset_shaders.this = (Sandbox *)_files;
  if (filename.field_2._8_4_ == 5) {
    bVar1 = onFileChange::anon_class_8_1_bc207785::operator()(&local_60,&this->m_frag_dependencies);
    if (bVar1) {
      local_9c = FRAG_SHADER;
      pvVar2 = std::vector<WatchFile,_std::allocator<WatchFile>_>::operator[]
                         (_files,(long)this->frag_index);
      std::
      tuple<FileType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      tuple<FileType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_98,&local_9c,&pvVar2->path);
      std::tie<FileType,std::__cxx11::string>
                ((FileType *)local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&filename.field_2 + 8));
      std::tuple<FileType&,std::__cxx11::string&>::operator=(local_b0,&local_98);
      std::
      tuple<FileType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~tuple(&local_98);
    }
    else {
      bVar1 = onFileChange::anon_class_8_1_bc207785::operator()
                        (&local_60,&this->m_vert_dependencies);
      if (bVar1) {
        local_dc = VERT_SHADER;
        pvVar2 = std::vector<WatchFile,_std::allocator<WatchFile>_>::operator[]
                           (_files,(long)this->vert_index);
        std::
        tuple<FileType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        tuple<FileType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (&local_d8,&local_dc,&pvVar2->path);
        std::tie<FileType,std::__cxx11::string>
                  ((FileType *)local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&filename.field_2 + 8));
        std::tuple<FileType&,std::__cxx11::string&>::operator=(local_f0,&local_d8);
        std::
        tuple<FileType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~tuple(&local_d8);
      }
    }
  }
  switch(filename.field_2._8_4_) {
  case 0:
    onFileChange::anon_class_24_3_63137608::operator()
              ((anon_class_24_3_63137608 *)&dependency_matches_filename,&this->m_frag_source,
               &this->m_frag_dependencies);
    break;
  case 1:
    onFileChange::anon_class_24_3_63137608::operator()
              ((anon_class_24_3_63137608 *)&dependency_matches_filename,&this->m_vert_source,
               &this->m_vert_dependencies);
    break;
  case 2:
    std::__cxx11::string::string((string *)&local_110,(string *)&reset_shaders._files);
    pvVar2 = std::vector<WatchFile,_std::allocator<WatchFile>_>::operator[]
                       (_files,(long)(int)filename.field_2._12_4_);
    (anonymous_namespace)::
    reload_uniforms<std::map<std::__cxx11::string,vera::Texture*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,vera::Texture*>>>>
              (&(this->uniforms).super_Scene.textures,&local_110,pvVar2);
    std::__cxx11::string::~string((string *)&local_110);
    break;
  case 3:
    break;
  case 4:
    std::__cxx11::string::string((string *)&local_130,(string *)&reset_shaders._files);
    pvVar2 = std::vector<WatchFile,_std::allocator<WatchFile>_>::operator[]
                       (_files,(long)(int)filename.field_2._12_4_);
    (anonymous_namespace)::
    reload_uniforms<std::map<std::__cxx11::string,vera::TextureCube*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,vera::TextureCube*>>>>
              (&(this->uniforms).super_Scene.cubemaps,&local_130,pvVar2);
    std::__cxx11::string::~string((string *)&local_130);
  }
  flagChange(this);
  std::__cxx11::string::~string((string *)&reset_shaders._files);
  return;
}

Assistant:

void Sandbox::onFileChange(WatchFileList &_files, int index) {
    FileType type = _files[index].type;
    std::string filename = _files[index].path;

    const auto reset_shaders = [&](std::string& source, vera::StringList& dependencies){
        source = "";
        dependencies.clear();
        if ( vera::loadGlslFrom(filename, &source, include_folders, &dependencies) )
            resetShaders(_files);
    };

    const auto dependency_matches_filename = [&](const vera::StringList& dependencies) {
        return std::any_of(std::begin(dependencies), std::end(dependencies), [&](const std::string& dependency){ return dependency == filename; });
    };

    // IF the change is on a dependency file, re route to the correct shader that need to be reload
    if (type == GLSL_DEPENDENCY) {
        using kv = std::tuple<FileType, std::string>;
        if (dependency_matches_filename(m_frag_dependencies)){
            std::tie(type, filename) = kv{FRAG_SHADER, _files[frag_index].path};
        } else if (dependency_matches_filename(m_vert_dependencies)){
            std::tie(type, filename) = kv{VERT_SHADER, _files[vert_index].path};
        }
    }
    switch(type) {
    case FRAG_SHADER:
        reset_shaders(m_frag_source, m_frag_dependencies);
        break;
    case VERT_SHADER:
        reset_shaders(m_vert_source, m_vert_dependencies);
        break;
    case GEOMETRY:
        // TODO
        break;
    case IMAGE:
        reload_uniforms(uniforms.textures, filename, _files[index]);
        break;
    case CUBEMAP:
        reload_uniforms(uniforms.cubemaps, filename, _files[index]);
        break;
    default: //'GLSL_DEPENDENCY' and 'IMAGE_BUMPMAP' not handled in switch
        break;
    }
    flagChange();
}